

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::cmComputeLinkDepends
          (cmComputeLinkDepends *this,cmGeneratorTarget *target,string *config)

{
  byte bVar1;
  bool bVar2;
  cmTargetLinkLibraryType cVar3;
  cmMakefile *pcVar4;
  cmLocalGenerator *this_00;
  cmGlobalGenerator *pcVar5;
  cmake *pcVar6;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmComputeLinkDepends *this_local;
  
  std::__cxx11::string::string((string *)&this->Config);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  vector(&this->FinalLinkEntries);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  vector(&this->EntryList);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->LinkEntryIndex);
  std::
  queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>,void>
            ((queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
              *)&this->BFSQueue);
  std::
  queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>,void>
            ((queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
              *)&this->SharedDepQueue);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->SharedDepFollowed);
  std::
  vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ::vector(&this->InferredDependSets);
  cmGraphAdjacencyList::cmGraphAdjacencyList(&this->EntryConstraintGraph);
  std::vector<char,_std::allocator<char>_>::vector(&this->ComponentVisited);
  std::vector<int,_std::allocator<int>_>::vector(&this->ComponentOrder);
  std::
  map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
  ::map(&this->PendingComponents);
  std::vector<int,_std::allocator<int>_>::vector(&this->FinalLinkOrder);
  std::vector<int,_std::allocator<int>_>::vector(&this->OriginalEntries);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->OldWrongConfigItems);
  this->Target = target;
  pcVar4 = cmTarget::GetMakefile(this->Target->Target);
  this->Makefile = pcVar4;
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  pcVar5 = cmLocalGenerator::GetGlobalGenerator(this_00);
  this->GlobalGenerator = pcVar5;
  pcVar6 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  this->CMakeInstance = pcVar6;
  bVar1 = std::__cxx11::string::empty();
  this->HasConfig = (bool)((bVar1 ^ 0xff) & 1);
  if ((this->HasConfig & 1U) == 0) {
    std::__cxx11::string::string
              ((string *)
               &debugConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &debugConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)config);
  }
  std::__cxx11::string::operator=
            ((string *)&this->Config,
             (string *)
             &debugConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &debugConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar6 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,pcVar6);
  cVar3 = CMP0003_ComputeLinkType
                    (&this->Config,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
  this->LinkType = cVar3;
  pcVar4 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"CMAKE_LINK_DEPENDS_DEBUG_MODE",&local_89);
  bVar2 = cmMakefile::IsOn(pcVar4,&local_88);
  this->DebugMode = bVar2;
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  this->OldLinkDirMode = false;
  this->CCG = (cmComputeComponentGraph *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  return;
}

Assistant:

cmComputeLinkDepends::cmComputeLinkDepends(const cmGeneratorTarget* target,
                                           const std::string& config)
{
  // Store context information.
  this->Target = target;
  this->Makefile = this->Target->Target->GetMakefile();
  this->GlobalGenerator =
    this->Target->GetLocalGenerator()->GetGlobalGenerator();
  this->CMakeInstance = this->GlobalGenerator->GetCMakeInstance();

  // The configuration being linked.
  this->HasConfig = !config.empty();
  this->Config = (this->HasConfig) ? config : std::string();
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  this->LinkType = CMP0003_ComputeLinkType(this->Config, debugConfigs);

  // Enable debug mode if requested.
  this->DebugMode = this->Makefile->IsOn("CMAKE_LINK_DEPENDS_DEBUG_MODE");

  // Assume no compatibility until set.
  this->OldLinkDirMode = false;

  // No computation has been done.
  this->CCG = CM_NULLPTR;
}